

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FSpecialAction,_FSpecialAction>::~TArray(TArray<FSpecialAction,_FSpecialAction> *this)

{
  if (this->Array != (FSpecialAction *)0x0) {
    M_Free(this->Array);
    this->Array = (FSpecialAction *)0x0;
    this->Most = 0;
    this->Count = 0;
  }
  return;
}

Assistant:

~TArray ()
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
			Array = NULL;
			Count = 0;
			Most = 0;
		}
	}